

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  anon_class_24_3_6b4c7fa8 func;
  anon_class_24_3_3815fa30 func_00;
  int n;
  Float FVar4;
  Float FVar5;
  Tuple2<pbrt::Point2,_float> TVar6;
  float fVar7;
  Point2f p;
  Float sumby;
  Float sumb;
  Bounds2f by;
  Tuple2<pbrt::Point2,_float> local_90;
  Point2<float> local_84;
  Float local_7c;
  WindowedPiecewiseConstant2D *local_78;
  Bounds2f *pBStack_70;
  Point2<float> *local_68;
  WindowedPiecewiseConstant2D *local_60;
  Bounds2f *pBStack_58;
  Float *local_50;
  Bounds2<float> local_48;
  Point2<float> local_38;
  
  FVar4 = SummedAreaTable::Sum(&this->sat,b);
  if ((FVar4 != 0.0) || (NAN(FVar4))) {
    local_7c = SummedAreaTable::Sum(&this->sat,b);
    local_50 = &local_7c;
    local_90.x = 0.0;
    local_90.y = 0.0;
    n = (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
        (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    func.b = b;
    func.this = this;
    func.sumb = local_50;
    local_60 = this;
    pBStack_58 = b;
    FVar4 = sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                      (func,(u->super_Tuple2<pbrt::Point2,_float>).x,
                       (b->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                       (b->pMax).super_Tuple2<pbrt::Point2,_float>.x,n);
    fVar7 = (float)n;
    local_90.x = FVar4;
    local_84.super_Tuple2<pbrt::Point2,_float>.y = (b->pMin).super_Tuple2<pbrt::Point2,_float>.y;
    fVar1 = FVar4 * fVar7;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
    auVar3 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),10);
    local_84.super_Tuple2<pbrt::Point2,_float>.x = auVar2._0_4_ / fVar7;
    local_38.super_Tuple2<pbrt::Point2,_float>.x = auVar3._0_4_ / fVar7;
    local_38.super_Tuple2<pbrt::Point2,_float>.y = (b->pMax).super_Tuple2<pbrt::Point2,_float>.y;
    Bounds2<float>::Bounds2(&local_48,&local_84,&local_38);
    if ((local_48.pMin.super_Tuple2<pbrt::Point2,_float>.x ==
         local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x) &&
       (!NAN(local_48.pMin.super_Tuple2<pbrt::Point2,_float>.x) &&
        !NAN(local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x))) {
      local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x =
           1.0 / fVar7 + local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    }
    FVar4 = SummedAreaTable::Sum(&this->sat,&local_48);
    FVar5 = 0.0;
    TVar6.x = 0.0;
    TVar6.y = 0.0;
    if ((FVar4 != 0.0) || (NAN(FVar4))) {
      local_84.super_Tuple2<pbrt::Point2,_float>.x = SummedAreaTable::Sum(&this->sat,&local_48);
      func_00.by = &local_48;
      func_00.this = this;
      func_00.sumby = (Float *)&local_84;
      local_78 = this;
      pBStack_70 = &local_48;
      local_68 = &local_84;
      FVar4 = sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                        (func_00,(u->super_Tuple2<pbrt::Point2,_float>).y,
                         (b->pMin).super_Tuple2<pbrt::Point2,_float>.y,
                         (b->pMax).super_Tuple2<pbrt::Point2,_float>.y,
                         (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                         (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      local_90.y = FVar4;
      FVar5 = PDF(this,(Point2f *)&local_90,b);
      TVar6 = local_90;
    }
    *pdf = FVar5;
  }
  else {
    *pdf = 0.0;
    TVar6.x = 0.0;
    TVar6.y = 0.0;
  }
  return (Point2f)TVar6;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Sum(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Sample marginal windowed function in the first dimension
        Float sumb = sat.Sum(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Sum(bx) / sumb;
        };
        Point2f p;
        int nx = func.xSize();
        p.x = sample(Px, u[0], b.pMin.x, b.pMax.x, nx);

        // Sample conditional windowed function in the second dimension
        Bounds2f by(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                    Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (by.pMin.x == by.pMax.x)
            by.pMax.x += 1.f / nx;
        if (sat.Sum(by) == 0) {
            // This can happen when we're provided a really narrow initial
            // bounding box
            *pdf = 0;
            return {};
        }
        Float sumby = sat.Sum(by);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f byy = by;
            byy.pMax.y = y;
            return sat.Sum(byy) / sumby;
        };
        p.y = sample(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = PDF(p, b);
        return p;
    }